

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O0

void vkt::Draw::anon_unknown_0::addDrawCase(TestCaseGroup *group,TestSpec *testSpec,TestFlags flags)

{
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawTest> *this;
  TestContext *testCtx;
  FlagsTestSpec local_260;
  FlagsTestSpec local_228;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream name;
  TestFlags flags_local;
  TestSpec *testSpec_local;
  TestCaseGroup *group_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"draw");
  if ((flags & 2) != 0) {
    std::operator<<((ostream *)local_198,"_indexed");
  }
  if ((flags & 4) != 0) {
    std::operator<<((ostream *)local_198,"_indirect");
  }
  if ((flags & 1) != 0) {
    std::operator<<((ostream *)local_198,"_instanced");
  }
  if ((flags & 0x10) != 0) {
    std::operator<<((ostream *)local_198,"_first_instance");
  }
  this = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawTest> *)operator_new(0xa8);
  testCtx = tcu::TestNode::getTestContext(&group->super_TestNode);
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
  FlagsTestSpec::FlagsTestSpec(&local_260,testSpec);
  addFlags(&local_228,&local_260,flags);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawTest>::InstanceFactory
            (this,testCtx,&local_1c8,&local_1e8,&local_228);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
  FlagsTestSpec::~FlagsTestSpec(&local_228);
  FlagsTestSpec::~FlagsTestSpec(&local_260);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void addDrawCase (tcu::TestCaseGroup* group, const DrawTest::TestSpec testSpec, const TestFlags flags)
{
	std::ostringstream name;
	name << "draw";

	if (flags & TEST_FLAG_INDEXED)			name << "_indexed";
	if (flags & TEST_FLAG_INDIRECT)			name << "_indirect";
	if (flags & TEST_FLAG_INSTANCED)		name << "_instanced";
	if (flags & TEST_FLAG_FIRST_INSTANCE)	name << "_first_instance";

	group->addChild(new InstanceFactory<DrawTest>(group->getTestContext(), name.str(), "", addFlags(testSpec, flags)));
}